

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_level_wallmarks.cxx
# Opt level: O0

void __thiscall xray_re::xr_level_wallmarks::save(xr_level_wallmarks *this,xr_writer *w)

{
  size_type value;
  xr_writer *w_local;
  xr_level_wallmarks *this_local;
  
  xr_writer::open_chunk(w,1);
  value = std::vector<xray_re::wm_slot_*,_std::allocator<xray_re::wm_slot_*>_>::size(&this->m_slots)
  ;
  xr_writer::w_size_u32(w,value);
  xr_writer::w_seq<std::vector<xray_re::wm_slot*,std::allocator<xray_re::wm_slot*>>,write_wm_slot>
            (w,this);
  xr_writer::close_chunk(w);
  return;
}

Assistant:

void xr_level_wallmarks::save(xr_writer& w) const
{
	w.open_chunk(1);
	w.w_size_u32(m_slots.size());
	w.w_seq(m_slots, write_wm_slot());
	w.close_chunk();
}